

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_sampler_handle
          (Impl *this,VkSampler sampler,VkSampler *out_sampler)

{
  bool bVar1;
  const_iterator cVar2;
  long *in_FS_OFFSET;
  VkSampler sampler_local;
  
  sampler_local = sampler;
  cVar2 = std::
          _Hashtable<VkSampler_T_*,_std::pair<VkSampler_T_*const,_unsigned_long>,_std::allocator<std::pair<VkSampler_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkSampler_T_*>,_std::hash<VkSampler_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->sampler_to_hash)._M_h,&sampler_local);
  if (cVar2.super__Node_iterator_base<std::pair<VkSampler_T_*const,_unsigned_long>,_false>._M_cur ==
      (__node_type *)0x0) {
    if (*(int *)(*in_FS_OFFSET + -0x18) < 2) {
      bVar1 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "Cannot find sampler in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                        );
      if (!bVar1) {
        fwrite("Fossilize WARN: Cannot find sampler in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
               ,0x7b,1,_stderr);
      }
    }
  }
  else {
    *out_sampler = *(VkSampler *)
                    ((long)cVar2.
                           super__Node_iterator_base<std::pair<VkSampler_T_*const,_unsigned_long>,_false>
                           ._M_cur + 0x10);
  }
  return cVar2.super__Node_iterator_base<std::pair<VkSampler_T_*const,_unsigned_long>,_false>._M_cur
         != (__node_type *)0x0;
}

Assistant:

bool StateRecorder::Impl::remap_sampler_handle(VkSampler sampler, VkSampler *out_sampler) const
{
	auto itr = sampler_to_hash.find(sampler);
	if (itr == end(sampler_to_hash))
	{
		LOGW_LEVEL("Cannot find sampler in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_sampler = api_object_cast<VkSampler>(uint64_t(itr->second));
		return true;
	}
}